

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashed.h
# Opt level: O3

Map * wasm::FunctionHasher::createMap(Map *__return_storage_ptr__,Module *module)

{
  _Rb_tree_header *p_Var1;
  pointer puVar2;
  mapped_type *pmVar3;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar4;
  _Head_base<0UL,_wasm::Function_*,_false> local_30;
  
  p_Var1 = &(__return_storage_ptr__->
            super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
            )._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->
  super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
  )._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->
  super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
  )._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->
  super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
  )._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (__return_storage_ptr__->
  super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
  )._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (__return_storage_ptr__->
  super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
  )._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  puVar4 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar4 != puVar2) {
    do {
      local_30._M_head_impl =
           (puVar4->_M_t).
           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
           super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      pmVar3 = std::
               map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
               ::operator[](&__return_storage_ptr__->
                             super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
                            ,&local_30._M_head_impl);
      *pmVar3 = 0;
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

static Map createMap(Module* module) {
    Map hashes;
    for (auto& func : module->functions) {
      // ensure an entry for each function - we must not modify the map shape in
      // parallel, just the values
      hashes[func.get()] = hash(0);
    }
    return hashes;
  }